

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void dot(_Bool canAssign)

{
  _Bool _Var1;
  undefined8 in_RAX;
  undefined1 in_DIL;
  uint8_t argCount;
  uint8_t name;
  undefined3 unaff_retaddr;
  TokenType type;
  char *message;
  
  message = (char *)(CONCAT17(in_DIL,(int7)in_RAX) & 0x1ffffffffffffff);
  consume(type,message);
  identifierConstant((Token *)0x1060cb);
  if ((((ulong)message & 0x100000000000000) == 0) || (_Var1 = match(0x1060e0), !_Var1)) {
    _Var1 = match(0x106103);
    if (_Var1) {
      argumentList();
      emitBytes('\0','\0');
      emitByte('\0');
    }
    else {
      emitBytes('\0','\0');
    }
  }
  else {
    expression();
    emitBytes('\0','\0');
  }
  return;
}

Assistant:

static void dot(bool canAssign) {
    consume(TOKEN_IDENTIFIER, "Expect property name after '.'.");
    uint8_t name = identifierConstant(&parser.previous);

    if (canAssign && match(TOKEN_EQUAL)) {
        expression();
        emitBytes(OP_SET_PROPERTY, name);
    } else if (match(TOKEN_LEFT_PAREN)) {
        uint8_t argCount = argumentList();
        emitBytes(OP_INVOKE, name);
        emitByte(argCount);
    }else {
        emitBytes(OP_GET_PROPERTY, name);
    }
}